

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O0

void wallet::WalletDescriptor::
     SerializationOps<DataStream,wallet::WalletDescriptor_const,ActionSerialize>(void)

{
  long in_FS_OFFSET;
  string descriptor_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  WalletDescriptor *in_stack_ffffffffffffff90;
  DataStream *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  DataStream *in_stack_ffffffffffffffa8;
  DataStream local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = &local_28;
  std::__cxx11::string::string(in_stack_ffffffffffffffa0);
  ActionSerialize::
  SerWrite<DataStream,wallet::WalletDescriptor_const&,wallet::WalletDescriptor::SerializationOps<DataStream,wallet::WalletDescriptor_const,ActionSerialize>(wallet::WalletDescriptor_const&,DataStream&,ActionSerialize)::_lambda(DataStream&,wallet::WalletDescriptor_const&)_1_>
            (s,in_stack_ffffffffffffff90,(anon_class_8_1_53f8d39f *)in_stack_ffffffffffffff88);
  ActionSerialize::SerReadWriteMany<DataStream,std::__cxx11::string,unsigned_long,int,int,int>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(unsigned_long *)s,
             (int *)in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,(int *)0x31ed4c);
  ActionSerialize::
  SerRead<DataStream,wallet::WalletDescriptor_const&,wallet::WalletDescriptor::SerializationOps<DataStream,wallet::WalletDescriptor_const,ActionSerialize>(wallet::WalletDescriptor_const&,DataStream&,ActionSerialize)::_lambda(DataStream&,wallet::WalletDescriptor&)_1_>
            (s,in_stack_ffffffffffffff90,(anon_class_8_1_53f8d39f *)in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(WalletDescriptor, obj)
    {
        std::string descriptor_str;
        SER_WRITE(obj, descriptor_str = obj.descriptor->ToString());
        READWRITE(descriptor_str, obj.creation_time, obj.next_index, obj.range_start, obj.range_end);
        SER_READ(obj, obj.DeserializeDescriptor(descriptor_str));
    }